

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::enable(ReferenceContext *this,deUint32 cap)

{
  if (cap == 0xb71) {
    this->m_depthTestEnabled = true;
    return;
  }
  if (cap == 0xb90) {
    this->m_stencilTestEnabled = true;
    return;
  }
  if (cap != 0xbd0) {
    if (cap == 0x8f9d) {
      if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100) {
        this->m_primitiveRestartSettableIndex = true;
        return;
      }
    }
    else {
      if (cap == 0xc11) {
        this->m_scissorEnabled = true;
        return;
      }
      if (cap == 0x8037) {
        this->m_polygonOffsetFillEnabled = true;
        return;
      }
      if (cap == 0x864f) {
        if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100) {
          this->m_depthClampEnabled = true;
          return;
        }
      }
      else if (cap == 0x8d69) {
        if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) != 0x100) {
          this->m_primitiveRestartFixedIndex = true;
          return;
        }
      }
      else if (cap == 0x8db9) {
        if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100) {
          this->m_sRGBUpdateEnabled = true;
          return;
        }
      }
      else if (cap == 0xbe2) {
        this->m_blendEnabled = true;
        return;
      }
    }
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
      return;
    }
  }
  return;
}

Assistant:

void ReferenceContext::enable (deUint32 cap)
{
	switch (cap)
	{
		case GL_BLEND:					m_blendEnabled				= true;	break;
		case GL_SCISSOR_TEST:			m_scissorEnabled			= true;	break;
		case GL_DEPTH_TEST:				m_depthTestEnabled			= true;	break;
		case GL_STENCIL_TEST:			m_stencilTestEnabled		= true;	break;
		case GL_POLYGON_OFFSET_FILL:	m_polygonOffsetFillEnabled	= true;	break;

		case GL_FRAMEBUFFER_SRGB:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_sRGBUpdateEnabled = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DEPTH_CLAMP:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_depthClampEnabled = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DITHER:
			// Not implemented - just ignored.
			break;

		case GL_PRIMITIVE_RESTART_FIXED_INDEX:
			if (!glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartFixedIndex = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_PRIMITIVE_RESTART:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartSettableIndex = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		default:
			setError(GL_INVALID_ENUM);
			break;
	}
}